

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void slang::ast::LocalAssertionVarSymbol::fromSyntax
               (Scope *scope,LocalVariableDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *results)

{
  bool bVar1;
  Compilation *pCVar2;
  DeclaratorSyntax *pDVar3;
  SourceLocation this;
  Symbol *this_00;
  Scope *in_RDI;
  string_view syntax_00;
  LocalAssertionVarSymbol *var;
  DeclaratorSyntax *declarator;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  Compilation *comp;
  DeclaratorSyntax *in_stack_ffffffffffffff58;
  Compilation *in_stack_ffffffffffffff60;
  Symbol *__range;
  Symbol *in_stack_ffffffffffffff70;
  Scope *in_stack_ffffffffffffff78;
  BumpAllocator *in_stack_ffffffffffffff80;
  Scope *in_stack_ffffffffffffff88;
  
  pCVar2 = Scope::getCompilation(in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x7f79f5);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x7f7a0c);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_stack_ffffffffffffff60,
                       (iterator_base<const_slang::syntax::DeclaratorSyntax_*> *)
                       in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x7f7a3a);
    in_stack_ffffffffffffff60 = pCVar2;
    syntax_00 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff70);
    this = parsing::Token::location(&pDVar3->name);
    this_00 = (Symbol *)
              BumpAllocator::
              emplace<slang::ast::LocalAssertionVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                        (in_stack_ffffffffffffff80,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_ffffffffffffff78,(SourceLocation *)in_stack_ffffffffffffff70);
    __range = this_00;
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x7f7aab);
    ValueSymbol::setDeclaredType
              ((ValueSymbol *)in_stack_ffffffffffffff60,(DataTypeSyntax *)in_stack_ffffffffffffff58)
    ;
    ValueSymbol::setFromDeclarator
              ((ValueSymbol *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff70 = this_00;
    in_stack_ffffffffffffff78 = in_RDI;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
    Symbol::setAttributes
              ((Symbol *)this,in_stack_ffffffffffffff88,
               (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>)
               syntax_00);
    SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *)
               in_stack_ffffffffffffff60,(LocalAssertionVarSymbol **)in_stack_ffffffffffffff58);
    Symbol::setParent(this_00,in_RDI);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void LocalAssertionVarSymbol::fromSyntax(const Scope& scope,
                                         const LocalVariableDeclarationSyntax& syntax,
                                         SmallVectorBase<const LocalAssertionVarSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto declarator : syntax.declarators) {
        auto var = comp.emplace<LocalAssertionVarSymbol>(declarator->name.valueText(),
                                                         declarator->name.location());
        var->setDeclaredType(*syntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        // Local variables don't get added to any scope as members but
        // we still need a parent pointer set so they can participate in lookups.
        var->setParent(scope);
    }
}